

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

void __thiscall
chaiscript::dispatch::Attribute_Access<const_int_*,_TestBaseType>::~Attribute_Access
          (Attribute_Access<const_int_*,_TestBaseType> *this)

{
  std::_Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~_Vector_base
            (&(this->m_param_types).
              super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>);
  Proxy_Function_Base::~Proxy_Function_Base(&this->super_Proxy_Function_Base);
  return;
}

Assistant:

explicit Attribute_Access(T Class::*t_attr)
          : Proxy_Function_Base(param_types(), 1)
          , m_attr(t_attr) {
      }